

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_outpoint.cpp
# Opt level: O0

void __thiscall OutPoint_Constructor_Test::TestBody(OutPoint_Constructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_130;
  Message local_128;
  int local_120;
  uint local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  Txid local_f8;
  string local_d8 [32];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  OutPoint outpoint;
  undefined1 local_80 [8];
  Txid txid;
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ByteData256 byte_data;
  OutPoint_Constructor_Test *this_local;
  
  byte_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"3412907856341290785634129078563412907856341290785634129078563412",&local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::Txid::Txid((Txid *)local_80,(ByteData256 *)local_28);
  cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar.message_,(Txid *)local_80,1);
  cfd::core::OutPoint::GetTxid();
  cfd::core::Txid::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b8,"outpoint.GetTxid().GetHex().c_str()",
             "\"1234567890123456789012345678901234567890123456789012345678901234\"",pcVar2,
             "1234567890123456789012345678901234567890123456789012345678901234");
  std::__cxx11::string::~string(local_d8);
  cfd::core::Txid::~Txid(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_outpoint.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_11c = cfd::core::OutPoint::GetVout();
  local_120 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_118,"outpoint.GetVout()","1",&local_11c,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_outpoint.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  cfd::core::OutPoint::~OutPoint((OutPoint *)&gtest_ar.message_);
  cfd::core::Txid::~Txid((Txid *)local_80);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(OutPoint, Constructor) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  OutPoint outpoint(txid, 1);
  EXPECT_STREQ(
      outpoint.GetTxid().GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(outpoint.GetVout(), 1);
}